

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS
ref_node_interpolate_edge
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL node1_weight,REF_INT new_node)

{
  uint uVar1;
  REF_DBL *pRVar2;
  REF_STATUS RVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  bool bVar10;
  REF_DBL log_m [6];
  REF_DBL log_m1 [6];
  REF_DBL log_m0 [6];
  
  if ((((node0 < 0) || (ref_node->max <= node0)) || (ref_node->max <= node1)) ||
     (((node1 < 0 || (ref_node->global[(uint)node0] < 0)) || (ref_node->global[(uint)node1] < 0))))
  {
    pcVar9 = "node invalid";
    RVar3 = 3;
    uVar6 = 0xa3e;
  }
  else {
    pRVar2 = ref_node->real;
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      pRVar2[new_node * 0xf + lVar7] =
           pRVar2[(ulong)(uint)(node0 * 0xf) + lVar7] * (1.0 - node1_weight) +
           pRVar2[(ulong)(uint)(node1 * 0xf) + lVar7] * node1_weight;
    }
    uVar1 = ref_node->naux;
    lVar7 = (long)(int)(uVar1 * new_node);
    lVar4 = (long)(int)(uVar1 * node1);
    lVar5 = (long)(int)(uVar1 * node0);
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
      pRVar2 = ref_node->aux;
      pRVar2[lVar7] = pRVar2[lVar5] * (1.0 - node1_weight) + pRVar2[lVar4] * node1_weight;
      lVar7 = lVar7 + 1;
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 1;
    }
    ref_node_metric_get_log(ref_node,node0,log_m0);
    ref_node_metric_get_log(ref_node,node1,log_m1);
    RVar3 = ref_matrix_weight_m(log_m0,log_m1,node1_weight,log_m);
    if (RVar3 == 0) {
      RVar3 = ref_node_metric_set_log(ref_node,new_node,log_m);
      if (RVar3 == 0) {
        return 0;
      }
      pcVar9 = "log new";
      uVar6 = 0xa4f;
    }
    else {
      pcVar9 = "log weight";
      uVar6 = 0xa4d;
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
         "ref_node_interpolate_edge",RVar3,pcVar9);
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_node_interpolate_edge(REF_NODE ref_node, REF_INT node0,
                                             REF_INT node1,
                                             REF_DBL node1_weight,
                                             REF_INT new_node) {
  REF_DBL log_m0[6], log_m1[6], log_m[6];
  REF_INT i;
  REF_DBL node0_weight = 1.0 - node1_weight;

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1))
    RSS(REF_INVALID, "node invalid");

  for (i = 0; i < 3; i++)
    ref_node_xyz(ref_node, i, new_node) =
        node0_weight * ref_node_xyz(ref_node, i, node0) +
        node1_weight * ref_node_xyz(ref_node, i, node1);

  for (i = 0; i < ref_node_naux(ref_node); i++)
    ref_node_aux(ref_node, i, new_node) =
        node0_weight * ref_node_aux(ref_node, i, node0) +
        node1_weight * ref_node_aux(ref_node, i, node1);

  RSS(ref_node_metric_get_log(ref_node, node0, log_m0), "log 0");
  RSS(ref_node_metric_get_log(ref_node, node1, log_m1), "log 1");

  RSS(ref_matrix_weight_m(log_m0, log_m1, node1_weight, log_m), "log weight");

  RSS(ref_node_metric_set_log(ref_node, new_node, log_m), "log new");

  return REF_SUCCESS;
}